

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall
soplex::SPxBasisBase<double>::multWithBase
          (SPxBasisBase<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *result)

{
  pointer pdVar1;
  SVectorBase<double> **ppSVar2;
  int *piVar3;
  pointer pdVar4;
  SVectorBase<double> *pSVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  Nonzero<double> *pNVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (this->matrixIsSetup == false) {
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
  }
  SSVectorBase<double>::clear(result);
  pdVar1 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)((ulong)((long)(x->super_VectorBase<double>).val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
  if (0 < (int)uVar6) {
    ppSVar2 = (this->matrix).data;
    piVar3 = (result->super_IdxSet).idx;
    pdVar4 = (result->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar7 = 0;
    do {
      pSVar5 = ppSVar2[uVar7];
      iVar8 = pSVar5->memused;
      if (iVar8 < 1) {
        dVar11 = 0.0;
      }
      else {
        pNVar9 = pSVar5->m_elem;
        iVar8 = iVar8 + 1;
        dVar12 = 0.0;
        dVar10 = 0.0;
        do {
          dVar13 = pNVar9->val * pdVar1[pNVar9->idx];
          dVar11 = dVar10 + dVar13;
          dVar12 = dVar12 + (dVar13 - (dVar11 - dVar10)) + (dVar10 - (dVar11 - (dVar11 - dVar10)));
          pNVar9 = pNVar9 + 1;
          iVar8 = iVar8 + -1;
          dVar10 = dVar11;
        } while (1 < iVar8);
        dVar11 = dVar11 + dVar12;
      }
      iVar8 = (result->super_IdxSet).num;
      (result->super_IdxSet).num = iVar8 + 1;
      piVar3[iVar8] = (int)uVar7;
      pdVar4[uVar7] = dVar11;
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar6 & 0x7fffffff));
  }
  return;
}

Assistant:

void SPxBasisBase<R>::multWithBase(SSVectorBase<R>& x, SSVectorBase<R>& result) const
{
   assert(status() > SINGULAR);
   assert(theLP->dim() == x.dim());
   assert(x.dim() == result.dim());

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   result.clear();

   assert(matrixIsSetup);

   for(int i = 0; i < x.dim(); ++i)
      result.add(i, (*matrix[i]) * x);

   return;
}